

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O1

void av1_rc_update_framerate(AV1_COMP *cpi,int width,int height)

{
  undefined4 uVar1;
  double dVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  
  iVar6 = av1_get_MBs(width,height);
  dVar2 = cpi->framerate;
  dVar11 = round((double)(cpi->oxcf).rc_cfg.target_bandwidth / dVar2);
  dVar12 = 2147483647.0;
  if (dVar11 <= 2147483647.0) {
    dVar12 = dVar11;
  }
  iVar7 = (int)dVar12;
  (cpi->rc).avg_frame_bandwidth = iVar7;
  lVar10 = ((long)(cpi->oxcf).rc_cfg.vbrmin_section * (long)iVar7) / 100;
  if (0x7ffffffe < lVar10) {
    lVar10 = 0x7fffffff;
  }
  iVar8 = 200;
  if (200 < (int)lVar10) {
    iVar8 = (int)lVar10;
  }
  (cpi->rc).min_frame_bandwidth = iVar8;
  lVar10 = ((long)(cpi->oxcf).rc_cfg.vbrmax_section * (long)iVar7) / 100;
  if (0x7ffffffe < lVar10) {
    lVar10 = 0x7fffffff;
  }
  iVar7 = (int)lVar10;
  if ((int)lVar10 < iVar6 * 0xfa) {
    iVar7 = iVar6 * 0xfa;
  }
  iVar6 = 0x1ee628;
  if (0x1ee628 < iVar7) {
    iVar6 = iVar7;
  }
  (cpi->rc).max_frame_bandwidth = iVar6;
  if ((((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) &&
     ((cpi->oxcf).rc_cfg.mode == AOM_Q)) {
    uVar4 = (cpi->oxcf).gf_cfg.min_gf_interval;
    uVar5 = (cpi->oxcf).gf_cfg.max_gf_interval;
    (cpi->rc).min_gf_interval = uVar4;
    (cpi->rc).max_gf_interval = uVar5;
    (cpi->rc).static_scene_max_gf_interval = uVar4 + 1;
  }
  else {
    iVar6 = (cpi->oxcf).gf_cfg.min_gf_interval;
    iVar7 = (cpi->oxcf).gf_cfg.max_gf_interval;
    (cpi->rc).max_gf_interval = iVar7;
    (cpi->rc).min_gf_interval = iVar6;
    if (iVar6 == 0) {
      uVar1 = (cpi->oxcf).frm_dim_cfg.width;
      uVar3 = (cpi->oxcf).frm_dim_cfg.height;
      iVar6 = 0x20;
      if ((int)(dVar2 * 0.125) < 0x20) {
        iVar6 = (int)(dVar2 * 0.125);
      }
      iVar8 = 4;
      if (4 < iVar6) {
        iVar8 = iVar6;
      }
      dVar12 = (double)(int)uVar3 * (double)(int)uVar1 * dVar2;
      if ((165888000.0 < dVar12) &&
         (iVar6 = (int)((dVar12 * 4.0) / 165888000.0 + 0.5), iVar8 <= iVar6)) {
        iVar8 = iVar6;
      }
      (cpi->rc).min_gf_interval = iVar8;
    }
    if (iVar7 == 0) {
      iVar6 = (cpi->rc).min_gf_interval;
      uVar9 = (uint)(dVar2 * 0.75);
      if (0x1f < (int)uVar9) {
        uVar9 = 0x20;
      }
      iVar7 = (uVar9 & 1) + uVar9;
      if (iVar7 <= iVar6) {
        iVar7 = iVar6;
      }
      if (iVar7 < 0x21) {
        iVar7 = 0x20;
      }
      (cpi->rc).max_gf_interval = iVar7;
    }
    if (cpi->ppi->lap_enabled == 0) {
      iVar6 = 0xfa;
    }
    else {
      iVar6 = (cpi->rc).max_gf_interval + 1;
    }
    (cpi->rc).static_scene_max_gf_interval = iVar6;
    if (iVar6 < (cpi->rc).max_gf_interval) {
      (cpi->rc).max_gf_interval = iVar6;
    }
    iVar6 = (cpi->rc).min_gf_interval;
    iVar7 = (cpi->rc).max_gf_interval;
    if (iVar6 < iVar7) {
      iVar7 = iVar6;
    }
    (cpi->rc).min_gf_interval = iVar7;
  }
  return;
}

Assistant:

void av1_rc_update_framerate(AV1_COMP *cpi, int width, int height) {
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  RATE_CONTROL *const rc = &cpi->rc;
  const int MBs = av1_get_MBs(width, height);

  rc->avg_frame_bandwidth = saturate_cast_double_to_int(
      round(oxcf->rc_cfg.target_bandwidth / cpi->framerate));

  int64_t vbr_min_bits =
      (int64_t)rc->avg_frame_bandwidth * oxcf->rc_cfg.vbrmin_section / 100;
  vbr_min_bits = AOMMIN(vbr_min_bits, INT_MAX);

  rc->min_frame_bandwidth = AOMMAX((int)vbr_min_bits, FRAME_OVERHEAD_BITS);

  // A maximum bitrate for a frame is defined.
  // The baseline for this aligns with HW implementations that
  // can support decode of 1080P content up to a bitrate of MAX_MB_RATE bits
  // per 16x16 MB (averaged over a frame). However this limit is extended if
  // a very high rate is given on the command line or the rate cannot
  // be achieved because of a user specified max q (e.g. when the user
  // specifies lossless encode.
  int64_t vbr_max_bits =
      (int64_t)rc->avg_frame_bandwidth * oxcf->rc_cfg.vbrmax_section / 100;
  vbr_max_bits = AOMMIN(vbr_max_bits, INT_MAX);

  rc->max_frame_bandwidth =
      AOMMAX(AOMMAX((MBs * MAX_MB_RATE), MAXRATE_1080P), (int)vbr_max_bits);

  set_gf_interval_range(cpi, rc);
}